

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_set_orig(NJDNode *node,char *str)

{
  char *pcVar1;
  
  free(node->orig);
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->orig = pcVar1;
  return;
}

Assistant:

void NJDNode_set_orig(NJDNode * node, const char *str)
{
   if (node->orig != NULL)
      free(node->orig);
   if (str == NULL || strlen(str) == 0)
      node->orig = NULL;
   else
      node->orig = strdup(str);
}